

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_A_FaceMaster(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  AActor *self;
  VMValue *pVVar7;
  AActor *other;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  double z_add;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00525046;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_00524d6e:
        self = (AActor *)0x0;
        pVVar7 = param;
        uVar6 = numparam;
      }
      else {
        pPVar5 = (self->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (self->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar8 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        bVar9 = pPVar5 == pPVar3;
        if (!bVar9 && !bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
        uVar6 = (uint)bVar8;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00525046;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      iVar4 = 0;
      if (numparam == 1) {
LAB_00524e50:
        local_40.Degrees = 270.0;
        local_38.Degrees = 0.0;
LAB_00524e53:
        local_48.Degrees = 0.0;
LAB_00524e56:
        local_50.Degrees = 0.0;
        z_add = 0.0;
        iVar4 = 0;
      }
      else {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_00525036;
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              pPVar5 = (PClass *)puVar2[1];
              if (pPVar5 == (PClass *)0x0) {
                pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
                puVar2[1] = pPVar5;
              }
              bVar8 = pPVar5 != (PClass *)0x0;
              if (pPVar5 != pPVar3 && bVar8) {
                do {
                  pPVar5 = pPVar5->ParentClass;
                  bVar8 = pPVar5 != (PClass *)0x0;
                  if (pPVar5 == pPVar3) break;
                } while (pPVar5 != (PClass *)0x0);
              }
              if (!bVar8) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_00525046;
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) goto LAB_00525036;
        }
        local_40.Degrees = 270.0;
        if (numparam < 3) goto LAB_00524e50;
        VVar1 = param[2].field_0.field_3.Type;
        if ((VVar1 != 0xff) &&
           ((VVar1 != '\x03' ||
            ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))))
        {
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_00525046;
        }
        if (numparam == 3) goto LAB_00524e50;
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_38.Degrees = (double)param[3].field_0.field_1.a;
        }
        else {
          local_38.Degrees = 0.0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                          ,0xb94,
                          "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
        local_48.Degrees = 0.0;
        if ((uint)numparam < 5) goto LAB_00524e53;
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_40.Degrees = (double)param[4].field_0.field_1.a;
        }
        else {
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                          ,0xb95,
                          "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
          local_40.Degrees = 270.0;
        }
        if (numparam == 5) goto LAB_00524e53;
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_48.Degrees = (double)param[5].field_0.field_1.a;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb96,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        local_50.Degrees = 0.0;
        if ((uint)numparam < 7) goto LAB_00524e56;
        VVar1 = param[6].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_50.Degrees = (double)param[6].field_0.field_1.a;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb97,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        z_add = 0.0;
        if (numparam != 7) {
          VVar1 = param[7].field_0.field_3.Type;
          if (VVar1 == '\0') {
            iVar4 = param[7].field_0.i;
          }
          else {
            iVar4 = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                            ,0xb98,
                            "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
          if (8 < (uint)numparam) {
            VVar1 = param[8].field_0.field_3.Type;
            if (VVar1 == '\x01') {
              z_add = param[8].field_0.f;
            }
            else if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                            ,0xb99,
                            "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
        }
      }
      other = (self->master).field_0.p;
      if (other != (AActor *)0x0) {
        if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00524e78;
        (self->master).field_0.p = (AActor *)0x0;
      }
      other = (AActor *)0x0;
LAB_00524e78:
      A_Face(self,other,&local_38,&local_40,&local_48,&local_50,iVar4,z_add);
      return 0;
    }
    if (self == (AActor *)0x0) goto LAB_00524d6e;
  }
LAB_00525036:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00525046:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FaceMaster)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_ANGLE_OPT(max_turn) { max_turn = 0.; }
	PARAM_ANGLE_OPT(max_pitch) { max_pitch = 270.; }
	PARAM_ANGLE_OPT(ang_offset) { ang_offset = 0.; }
	PARAM_ANGLE_OPT(pitch_offset) { pitch_offset = 0.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	PARAM_FLOAT_OPT(z_add) { z_add = 0; }

	A_Face(self, self->master, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}